

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall common::anon_unknown_0::CleanupHandler::~CleanupHandler(CleanupHandler *this)

{
  function<void_()> *pfVar1;
  _Manager_type *pp_Var2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Handler)._vptr_Handler = (_func_int **)&PTR__CleanupHandler_013bb610;
  pfVar1 = &this->m_cleanup;
  pp_Var2 = &(this->m_cleanup).super__Function_base._M_manager;
  if ((this->m_cleanup).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_cleanup)._M_invoker)((_Any_data *)pfVar1);
    if (*pp_Var2 != (_Manager_type)0x0) {
      (**pp_Var2)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      *pp_Var2 = (_Manager_type)0x0;
      (this->m_cleanup)._M_invoker = (_Invoker_type)0x0;
    }
  }
  if (*pp_Var2 != (_Manager_type)0x0) {
    (**pp_Var2)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CleanupHandler() override { if (!m_cleanup) return; m_cleanup(); m_cleanup = nullptr; }